

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O1

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
::DeviceObjectBase(DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                   *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
                  ShaderBindingTableDesc *ObjDesc,bool bIsDeviceInternal)

{
  atomic<int> *paVar1;
  RenderDeviceVkImpl *pRVar2;
  IPipelineState *pIVar3;
  int iVar4;
  size_t sVar5;
  IMemoryAllocator *pIVar6;
  char *pcVar7;
  undefined4 extraout_var_00;
  ShaderBindingTableDesc *Args_1;
  string msg;
  string local_48;
  undefined4 extraout_var;
  
  Args_1 = ObjDesc;
  RefCountedObject<Diligent::IShaderBindingTableVk>::RefCountedObject<>
            ((RefCountedObject<Diligent::IShaderBindingTableVk> *)this,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderBindingTableVk>).
  super_RefCountedObject<Diligent::IShaderBindingTableVk>.super_IShaderBindingTableVk.
  super_IShaderBindingTable.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_00938730;
  this->m_pDevice = pDevice;
  pIVar3 = ObjDesc->pPSO;
  (this->m_Desc).super_DeviceObjectAttribs.Name = (ObjDesc->super_DeviceObjectAttribs).Name;
  (this->m_Desc).pPSO = pIVar3;
  if (pDevice == (RenderDeviceVkImpl *)0x0) {
    iVar4 = 0;
  }
  else {
    LOCK();
    paVar1 = &(pDevice->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_UniqueId;
    iVar4 = (paVar1->super___atomic_base<int>)._M_i;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    iVar4 = iVar4 + 1;
  }
  this->m_UniqueID = iVar4;
  this->m_bIsDeviceInternal = bIsDeviceInternal;
  (this->m_pUserData).m_pObject = (IObject *)0x0;
  if (!bIsDeviceInternal) {
    if (this->m_pDevice == (RenderDeviceVkImpl *)0x0) {
      FormatString<char[26],char[21]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pDevice != nullptr",(char (*) [21])Args_1);
      Args_1 = (ShaderBindingTableDesc *)0x47;
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"DeviceObjectBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                 ,0x47);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    pRVar2 = this->m_pDevice;
    if ((pRVar2->
        super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
        ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
        super_ObjectBase<Diligent::IRenderDeviceVk>.
        super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters == (RefCountersImpl *)0x0)
    {
      FormatString<char[26],char[26]>
                (&local_48,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",(char (*) [26])Args_1);
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pRVar2->
               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
               ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
               super_ObjectBase<Diligent::IRenderDeviceVk>.
               super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters);
  }
  pcVar7 = (ObjDesc->super_DeviceObjectAttribs).Name;
  if (pcVar7 == (char *)0x0) {
    pIVar6 = GetStringAllocator();
    iVar4 = (**pIVar6->_vptr_IMemoryAllocator)
                      (pIVar6,0x13,"Object address string",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x55);
    pcVar7 = (char *)CONCAT44(extraout_var_00,iVar4);
    snprintf(pcVar7,0x13,"0x%llX",this);
  }
  else {
    sVar5 = strlen(pcVar7);
    pIVar6 = GetStringAllocator();
    iVar4 = (**pIVar6->_vptr_IMemoryAllocator)
                      (pIVar6,sVar5 + 1,"Object name copy",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectBase.hpp"
                       ,0x4e);
    pcVar7 = (char *)CONCAT44(extraout_var,iVar4);
    memcpy(pcVar7,(ObjDesc->super_DeviceObjectAttribs).Name,sVar5 + 1);
  }
  (this->m_Desc).super_DeviceObjectAttribs.Name = pcVar7;
  return;
}

Assistant:

DeviceObjectBase(IReferenceCounters*   pRefCounters,
                     RenderDeviceImplType* pDevice,
                     const ObjectDescType& ObjDesc,
                     bool                  bIsDeviceInternal = false) :
        // clang-format off
        TBase              {pRefCounters},
        m_pDevice          {pDevice          },
        m_Desc             {ObjDesc          },
        m_UniqueID         {pDevice != nullptr ? pDevice->GenerateUniqueId() : 0},
        m_bIsDeviceInternal{bIsDeviceInternal}
    //clang-format on
    {
        // Do not keep strong reference to the device if the object is an internal device object
        if (!m_bIsDeviceInternal)
        {
            // Device can be null if object is used for serialization
            VERIFY_EXPR(m_pDevice != nullptr);
            m_pDevice->AddRef();
        }

        if (ObjDesc.Name != nullptr)
        {
            size_t  size     = strlen(ObjDesc.Name) + 1;
            char* NameCopy = ALLOCATE(GetStringAllocator(), "Object name copy", char, size);
            memcpy(NameCopy, ObjDesc.Name, size);
            m_Desc.Name = NameCopy;
        }
        else
        {
            size_t size       = 16 + 2 + 1; // 0x12345678
            char*  AddressStr = ALLOCATE(GetStringAllocator(), "Object address string", char, size);
            snprintf(AddressStr, size, "0x%llX", static_cast<unsigned long long>(reinterpret_cast<size_t>(this)));
            m_Desc.Name = AddressStr;
        }

        //                        !!!WARNING!!!
        // We cannot add resource to the hash table from here, because the object
        // has not been completely created yet and the reference counters object
        // is not initialized!
        //m_pDevice->AddResourceToHash( this ); - ERROR!
    }